

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void sorter_tim_sort_merge_left
               (int64_t *A_src,int64_t *B_src,size_t A,size_t B,int64_t *storage,int *min_gallop_p)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  long in_RCX;
  long in_RDX;
  long lVar5;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  void *in_R8;
  int *in_R9;
  int64_t *dst;
  int min_gallop;
  int b_count;
  int a_count;
  size_t k;
  size_t pb;
  size_t pa;
  size_t pdst;
  int local_5c;
  int local_58;
  int local_54;
  long local_48;
  long local_40;
  long local_38;
  
  local_5c = *in_R9;
  memcpy(in_R8,in_RDI,in_RDX << 3);
  local_40 = 0;
  local_48 = 1;
  local_38 = 1;
  *in_RDI = *in_RSI;
  lVar3 = local_38;
  if (in_RCX == 1) {
LAB_0011a38c:
    local_38 = lVar3;
    memcpy(in_RDI + local_38,(void *)((long)in_R8 + local_40 * 8),(in_RDX - local_40) * 8);
    *in_R9 = local_5c;
    return;
  }
  do {
    local_58 = 0;
    local_54 = 0;
    while( true ) {
      if (*(long *)((long)in_R8 + local_40 * 8) - in_RSI[local_48] < 1) {
        in_RDI[local_38] = *(undefined8 *)((long)in_R8 + local_40 * 8);
        local_54 = local_54 + 1;
        local_58 = 0;
        local_40 = local_40 + 1;
        iVar1 = local_54;
      }
      else {
        lVar4 = local_48 + 1;
        in_RDI[local_38] = in_RSI[local_48];
        local_58 = local_58 + 1;
        local_54 = 0;
        lVar3 = local_38 + 1;
        local_48 = lVar4;
        iVar1 = local_58;
        if (lVar4 == in_RCX) goto LAB_0011a38c;
      }
      if (local_5c <= iVar1) break;
      local_38 = local_38 + 1;
    }
    local_38 = local_38 + 1;
    local_5c = local_5c + 1;
    do {
      if (local_5c != 0) {
        local_5c = local_5c + -1;
      }
      sVar2 = sorter_tim_sort_gallop
                        ((int64_t *)((long)in_R8 + local_40 * 8),in_RDX - local_40,in_RSI[local_48],
                         0,1);
      memcpy(in_RDI + local_38,(void *)((long)in_R8 + local_40 * 8),sVar2 << 3);
      lVar3 = sVar2 + local_38;
      lVar4 = sVar2 + local_40;
      lVar5 = local_48 + 1;
      local_38 = lVar3 + 1;
      in_RDI[lVar3] = in_RSI[local_48];
      local_40 = lVar4;
      lVar3 = local_38;
      if (lVar5 == in_RCX) goto LAB_0011a38c;
      if ((local_54 != 0) && (local_48 = lVar5, sVar2 < 7)) break;
      sVar2 = sorter_tim_sort_gallop
                        (in_RSI + lVar5,in_RCX - lVar5,*(int64_t *)((long)in_R8 + lVar4 * 8),0,0);
      memmove(in_RDI + local_38,in_RSI + lVar5,sVar2 << 3);
      lVar3 = sVar2 + local_38;
      local_48 = sVar2 + lVar5;
      if (local_48 == in_RCX) goto LAB_0011a38c;
      local_40 = lVar4 + 1;
      local_38 = lVar3 + 1;
      in_RDI[lVar3] = *(undefined8 *)((long)in_R8 + lVar4 * 8);
    } while ((local_58 == 0) || (6 < sVar2));
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

static void TIM_SORT_MERGE_LEFT(SORT_TYPE *A_src, SORT_TYPE *B_src,
                                const size_t A, const size_t B,
                                SORT_TYPE *storage, int *min_gallop_p) {
  size_t pdst, pa, pb, k;
  int a_count, b_count;
  int min_gallop = *min_gallop_p;
  SORT_TYPE *dst = A_src;
  SORT_TYPE_CPY(storage, dst, A);
  A_src = storage;
  pdst = pa = pb = 0;
  /* first element must in B, otherwise skipped in the caller  */
  dst[pdst++] = B_src[pb++];

  if (B == 1) {
    goto copyA;
  }

  for (;;) {
    a_count = b_count = 0;

    for (;;) {
      if (SORT_CMP(A_src[pa], B_src[pb]) <= 0) {
        dst[pdst++] = A_src[pa++];
        ++a_count;
        b_count = 0;

        /* No need to check if pa == A because the last element must be in A
         * so pb will reach to B first. You can check pa == A-1 and do
         * some optimization if you wish.*/
        if (min_gallop <= a_count) {
          break;
        }
      } else {
        dst[pdst++] = B_src[pb++];
        ++b_count;
        a_count = 0;

        if (pb == B) {
          goto copyA;
        }

        if (min_gallop <= b_count) {
          break;
        }
      }
    }

    ++min_gallop;

    for (;;) {
      if (min_gallop != 0) {
        min_gallop--;
      }

      k = TIM_SORT_GALLOP(&A_src[pa], A - pa, B_src[pb], 0, 1);
      SORT_TYPE_CPY(&dst[pdst], &A_src[pa], k);
      pdst += k;
      pa += k;
      /* now we know the next must be in B */
      dst[pdst++] = B_src[pb++];

      if (pb == B) {
        goto copyA;
      }

      if (a_count && k < TIM_SORT_MIN_GALLOP) {
        ++min_gallop;
        break;
      }

      k = TIM_SORT_GALLOP(&B_src[pb], B - pb, A_src[pa], 0, 0);
      SORT_TYPE_MOVE(&dst[pdst], &B_src[pb], k);
      pdst += k;
      pb += k;

      if (pb == B) {
        goto copyA;
      }

      dst[pdst++] = A_src[pa++];

      if (b_count && k < TIM_SORT_MIN_GALLOP) {
        ++min_gallop;
        break;
      }
    }
  }

copyA:
  SORT_TYPE_CPY(&dst[pdst], &A_src[pa], A - pa);
  *min_gallop_p = min_gallop;
  return;
}